

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

string * __thiscall
helics::RandomDelayFilterOperation::getString_abi_cxx11_
          (RandomDelayFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_04;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_05;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_06;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_07;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_08;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  bool bVar2;
  pointer pRVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t in_RSI;
  string *in_RDI;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>
  *distPair;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
  *__range2;
  RandomDistributions currentDist;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
  *in_stack_fffffffffffffe28;
  _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>
  *in_stack_fffffffffffffe30;
  string *this_00;
  char *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  allocator<char> *in_stack_fffffffffffffe60;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  allocator<char> local_89;
  reference local_88;
  _Self local_80;
  _Self local_78;
  undefined1 *local_70;
  RandomDistributions local_64;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_18;
  undefined8 local_10;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)in_RDI);
  __x._M_str = (char *)in_stack_fffffffffffffe60;
  __x._M_len = in_stack_fffffffffffffe58;
  __y._M_str = in_stack_fffffffffffffe50;
  __y._M_len = in_RSI;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    local_50 = local_18;
    local_48 = local_10;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
    __x_00._M_str = (char *)in_stack_fffffffffffffe60;
    __x_00._M_len = in_stack_fffffffffffffe58;
    __y_00._M_str = in_stack_fffffffffffffe50;
    __y_00._M_len = in_RSI;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_01._M_str = (char *)in_stack_fffffffffffffe60;
      __x_01._M_len = in_stack_fffffffffffffe58;
      __y_01._M_str = in_stack_fffffffffffffe50;
      __y_01._M_len = in_RSI;
      bVar2 = std::operator==(__x_01,__y_01);
      if (bVar2) {
LAB_0031a8a4:
        pRVar3 = std::
                 unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                 ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                               *)0x31a8b2);
        std::__atomic_float<double>::load(&(pRVar3->param1).super___atomic_float<double>,seq_cst);
        std::__cxx11::to_string((double)in_RDI);
        return this_00;
      }
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_02._M_str = (char *)in_stack_fffffffffffffe60;
      __x_02._M_len = in_stack_fffffffffffffe58;
      __y_02._M_str = in_stack_fffffffffffffe50;
      __y_02._M_len = in_RSI;
      bVar2 = std::operator==(__x_02,__y_02);
      if (bVar2) goto LAB_0031a8a4;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_03._M_str = (char *)in_stack_fffffffffffffe60;
      __x_03._M_len = in_stack_fffffffffffffe58;
      __y_03._M_str = in_stack_fffffffffffffe50;
      __y_03._M_len = in_RSI;
      bVar2 = std::operator==(__x_03,__y_03);
      if (bVar2) goto LAB_0031a8a4;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_04._M_str = (char *)in_stack_fffffffffffffe60;
      __x_04._M_len = in_stack_fffffffffffffe58;
      __y_04._M_str = in_stack_fffffffffffffe50;
      __y_04._M_len = in_RSI;
      bVar2 = std::operator==(__x_04,__y_04);
      if (bVar2) goto LAB_0031a8a4;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_05._M_str = (char *)in_stack_fffffffffffffe60;
      __x_05._M_len = in_stack_fffffffffffffe58;
      __y_05._M_str = in_stack_fffffffffffffe50;
      __y_05._M_len = in_RSI;
      bVar2 = std::operator==(__x_05,__y_05);
      if (bVar2) {
LAB_0031aa20:
        pRVar3 = std::
                 unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                 ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                               *)0x31aa2e);
        std::__atomic_float<double>::load(&(pRVar3->param2).super___atomic_float<double>,seq_cst);
        std::__cxx11::to_string((double)in_RDI);
        return this_00;
      }
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_06._M_str = (char *)in_stack_fffffffffffffe60;
      __x_06._M_len = in_stack_fffffffffffffe58;
      __y_06._M_str = in_stack_fffffffffffffe50;
      __y_06._M_len = in_RSI;
      bVar2 = std::operator==(__x_06,__y_06);
      if (bVar2) goto LAB_0031aa20;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_07._M_str = (char *)in_stack_fffffffffffffe60;
      __x_07._M_len = in_stack_fffffffffffffe58;
      __y_07._M_str = in_stack_fffffffffffffe50;
      __y_07._M_len = in_RSI;
      bVar2 = std::operator==(__x_07,__y_07);
      if (bVar2) goto LAB_0031aa20;
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RDI);
      __x_08._M_str = (char *)in_stack_fffffffffffffe60;
      __x_08._M_len = in_stack_fffffffffffffe58;
      __y_08._M_str = in_stack_fffffffffffffe50;
      __y_08._M_len = in_RSI;
      bVar2 = std::operator==(__x_08,__y_08);
      if (bVar2) goto LAB_0031aa20;
      goto LAB_0031aa4f;
    }
  }
  pRVar3 = std::
           unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
           ::operator->((unique_ptr<helics::RandomDelayGenerator,_std::default_delete<helics::RandomDelayGenerator>_>
                         *)0x31a60e);
  local_64 = std::atomic<helics::RandomDistributions>::load(&pRVar3->dist,seq_cst);
  local_70 = distMap;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
       ::begin(in_stack_fffffffffffffe28);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>_>
       ::end(in_stack_fffffffffffffe28);
  while (bVar2 = std::operator==(&local_78,&local_80), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_88 = std::
               _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>
                            *)0x31a686);
    if (local_88->second == local_64) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      std::allocator<char>::~allocator(&local_89);
      return this_00;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::RandomDistributions>_>
    ::operator++(in_stack_fffffffffffffe30);
  }
LAB_0031aa4f:
  sVar1._M_str = (char *)in_RDI;
  sVar1._M_len = (size_t)in_stack_fffffffffffffe30;
  FilterOperations::getString_abi_cxx11_((FilterOperations *)in_stack_fffffffffffffe28,sVar1);
  return this_00;
}

Assistant:

std::string RandomDelayFilterOperation::getString(std::string_view property)
{
    if ((property == "dist") || (property == "distribution")) {
        auto currentDist = rdelayGen->dist.load();
        for (const auto& distPair : distMap) {
            if (distPair.second == currentDist) {
                return std::string(distPair.first);
            }
        }
    } else if ((property == "param1") || (property == "mean") || (property == "min") ||
               (property == "alpha")) {
        return std::to_string(rdelayGen->param1.load());
    } else if ((property == "param2") || (property == "stddev") || (property == "max") ||
               (property == "beta")) {
        return std::to_string(rdelayGen->param2.load());
    }
    return FilterOperations::getString(property);
}